

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::DepthCompareCase::render(DepthCompareCase *this,Context *context)

{
  uint program;
  uint uVar1;
  DepthShader shader;
  Vec3 local_1c8;
  Vec3 local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  DepthShader local_180;
  
  DepthShader::DepthShader(&local_180);
  program = (*context->_vptr_Context[0x75])(context,&local_180);
  local_198 = 0x3f800000;
  uStack_190 = 0x3f80000000000000;
  local_1a8 = 0x3f80000000000000;
  uStack_1a0 = 0x3f80000000000000;
  (*context->_vptr_Context[0x2b])(0x3f800000,context);
  (*context->_vptr_Context[0x2d])(context,0x100);
  (*context->_vptr_Context[0x33])(context,0xb71);
  (*context->_vptr_Context[0x39])(context,0x207);
  (*context->_vptr_Context[0x76])(context,(ulong)program);
  uVar1 = (*context->_vptr_Context[0x66])(context,(ulong)program,"u_color");
  (*context->_vptr_Context[0x5f])(context,(ulong)uVar1,1,&local_198);
  local_1b8.m_data[0] = -1.0;
  local_1b8.m_data[1] = -1.0;
  local_1b8.m_data[2] = 0.2;
  local_1c8.m_data[0] = 0.0;
  local_1c8.m_data[1] = 0.0;
  local_1c8.m_data[2] = 0.2;
  sglr::drawQuad(context,program,&local_1b8,&local_1c8);
  (*context->_vptr_Context[0x39])(context,(ulong)this->m_compareOp);
  (*context->_vptr_Context[0x76])(context,(ulong)program);
  uVar1 = (*context->_vptr_Context[0x66])(context,(ulong)program,"u_color");
  (*context->_vptr_Context[0x5f])(context,(ulong)uVar1,1,&local_1a8);
  local_1b8.m_data[0] = -1.0;
  local_1b8.m_data[1] = -1.0;
  local_1b8.m_data[2] = 0.2;
  local_1c8.m_data[0] = 0.0;
  local_1c8.m_data[1] = 0.0;
  local_1c8.m_data[2] = 0.2;
  sglr::drawQuad(context,program,&local_1b8,&local_1c8);
  (*context->_vptr_Context[0x39])(context,0x207);
  (*context->_vptr_Context[0x76])(context,(ulong)program);
  uVar1 = (*context->_vptr_Context[0x66])(context,(ulong)program,"u_color");
  (*context->_vptr_Context[0x5f])(context,(ulong)uVar1,1,&local_198);
  local_1b8.m_data[0] = -1.0;
  local_1b8.m_data[1] = 0.0;
  local_1b8.m_data[2] = -0.4;
  local_1c8.m_data[0] = 0.0;
  local_1c8.m_data[1] = 1.0;
  local_1c8.m_data[2] = -0.4;
  sglr::drawQuad(context,program,&local_1b8,&local_1c8);
  (*context->_vptr_Context[0x39])(context,(ulong)this->m_compareOp);
  (*context->_vptr_Context[0x76])(context,(ulong)program);
  uVar1 = (*context->_vptr_Context[0x66])(context,(ulong)program,"u_color");
  (*context->_vptr_Context[0x5f])(context,(ulong)uVar1,1,&local_1a8);
  local_1b8.m_data[0] = -1.0;
  local_1b8.m_data[1] = 0.0;
  local_1b8.m_data[2] = -0.1;
  local_1c8.m_data[0] = 0.0;
  local_1c8.m_data[1] = 1.0;
  local_1c8.m_data[2] = -0.1;
  sglr::drawQuad(context,program,&local_1b8,&local_1c8);
  (*context->_vptr_Context[0x39])(context,0x207);
  (*context->_vptr_Context[0x76])(context,(ulong)program);
  uVar1 = (*context->_vptr_Context[0x66])(context,(ulong)program,"u_color");
  (*context->_vptr_Context[0x5f])(context,(ulong)uVar1,1,&local_198);
  local_1b8.m_data[0] = 0.0;
  local_1b8.m_data[1] = -1.0;
  local_1b8.m_data[2] = 0.5;
  local_1c8.m_data[0] = 1.0;
  local_1c8.m_data[1] = 0.0;
  local_1c8.m_data[2] = 0.5;
  sglr::drawQuad(context,program,&local_1b8,&local_1c8);
  (*context->_vptr_Context[0x39])(context,(ulong)this->m_compareOp);
  (*context->_vptr_Context[0x76])(context,(ulong)program);
  uVar1 = (*context->_vptr_Context[0x66])(context,(ulong)program,"u_color");
  (*context->_vptr_Context[0x5f])(context,(ulong)uVar1,1,&local_1a8);
  local_1b8.m_data[0] = 0.0;
  local_1b8.m_data[1] = -1.0;
  local_1b8.m_data[2] = 0.3;
  local_1c8.m_data[0] = 1.0;
  local_1c8.m_data[1] = 0.0;
  local_1c8.m_data[2] = 0.3;
  sglr::drawQuad(context,program,&local_1b8,&local_1c8);
  (*context->_vptr_Context[0x39])(context,0x207);
  (*context->_vptr_Context[0x76])(context,(ulong)program);
  uVar1 = (*context->_vptr_Context[0x66])(context,(ulong)program,"u_color");
  (*context->_vptr_Context[0x5f])(context,(ulong)uVar1,1,&local_198);
  local_1b8.m_data[0] = 0.0;
  local_1b8.m_data[1] = 0.0;
  local_1b8.m_data[2] = 0.0;
  local_1c8.m_data[0] = 1.0;
  local_1c8.m_data[1] = 1.0;
  local_1c8.m_data[2] = 0.0;
  sglr::drawQuad(context,program,&local_1b8,&local_1c8);
  (*context->_vptr_Context[0x39])(context,(ulong)this->m_compareOp);
  (*context->_vptr_Context[0x76])(context,(ulong)program);
  uVar1 = (*context->_vptr_Context[0x66])(context,(ulong)program,"u_color");
  (*context->_vptr_Context[0x5f])(context,(ulong)uVar1,1,&local_1a8);
  local_1b8.m_data[0] = 0.0;
  local_1b8.m_data[1] = 0.0;
  local_1b8.m_data[2] = -1.0;
  local_1c8.m_data[0] = 1.0;
  local_1c8.m_data[1] = 1.0;
  local_1c8.m_data[2] = 1.0;
  sglr::drawQuad(context,program,&local_1b8,&local_1c8);
  sglr::ShaderProgram::~ShaderProgram(&local_180.super_ShaderProgram);
  return;
}

Assistant:

void render (sglr::Context& context)
	{
		using tcu::Vec3;

		DepthShader	shader;
		deUint32	shaderID = context.createProgram(&shader);

		tcu::Vec4	red		(1.0f, 0.0f, 0.0f, 1.0);
		tcu::Vec4	green	(0.0f, 1.0f, 0.0f, 1.0f);

		// Clear depth to 1
		context.clearDepthf(1.0f);
		context.clear(GL_DEPTH_BUFFER_BIT);

		// Enable depth test.
		context.enable(GL_DEPTH_TEST);

		// Upper left: two quads with same depth
		context.depthFunc(GL_ALWAYS);
		shader.setColor(context, shaderID, red);
		sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.2f),	Vec3(0.0f, 0.0f, 0.2f));
		context.depthFunc(m_compareOp);
		shader.setColor(context, shaderID, green);
		sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.2f),	Vec3(0.0f, 0.0f, 0.2f));

		// Lower left: two quads, d1 < d2
		context.depthFunc(GL_ALWAYS);
		shader.setColor(context, shaderID, red);
		sglr::drawQuad(context, shaderID, Vec3(-1.0f, 0.0f, -0.4f),	Vec3(0.0f, 1.0f, -0.4f));
		context.depthFunc(m_compareOp);
		shader.setColor(context, shaderID, green);
		sglr::drawQuad(context, shaderID, Vec3(-1.0f, 0.0f, -0.1f),	Vec3(0.0f, 1.0f, -0.1f));

		// Upper right: two quads, d1 > d2
		context.depthFunc(GL_ALWAYS);
		shader.setColor(context, shaderID, red);
		sglr::drawQuad(context, shaderID, Vec3(0.0f, -1.0f, 0.5f),	Vec3(1.0f, 0.0f, 0.5f));
		context.depthFunc(m_compareOp);
		shader.setColor(context, shaderID, green);
		sglr::drawQuad(context, shaderID, Vec3(0.0f, -1.0f, 0.3f),	Vec3(1.0f, 0.0f, 0.3f));

		// Lower right: two quads, d1 = 0, d2 = [-1..1]
		context.depthFunc(GL_ALWAYS);
		shader.setColor(context, shaderID, red);
		sglr::drawQuad(context, shaderID, Vec3(0.0f, 0.0f, 0.0f),	Vec3(1.0f, 1.0f, 0.0f));
		context.depthFunc(m_compareOp);
		shader.setColor(context, shaderID, green);
		sglr::drawQuad(context, shaderID, Vec3(0.0f, 0.0f, -1.0f),	Vec3(1.0f, 1.0f, 1.0f));
	}